

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_transform.h
# Opt level: O0

triplet<unsigned_char> __thiscall
charls::transform_hp3<unsigned_char>::inverse::operator()(inverse *this,int v1,int v2,int v3)

{
  triplet<unsigned_char> local_2c;
  int g;
  int v3_local;
  int v2_local;
  int v1_local;
  inverse *this_local;
  triplet<unsigned_char> rgb;
  
  local_2c.field_1.v2 = ((char)v1 + '@') - (char)(v3 + v2 >> 2);
  triplet<unsigned_char>::triplet((triplet<unsigned_char> *)((long)&this_local + 5));
  local_2c.field_2.v3 = (char)v2 + local_2c.field_1.v2 + 0x80;
  local_2c.field_0.v1 = (char)v3 + local_2c.field_1.v2 + -0x80;
  return local_2c;
}

Assistant:

operator()(const int v1, const int v2, const int v3) const noexcept
        {
            const int g = static_cast<int>(v1 - ((v3 + v2) >> 2) + range_ / 4);
            triplet<T> rgb;
            rgb.R = static_cast<T>(v3 + g - range_ / 2); // new R
            rgb.G = static_cast<T>(g);                   // new G
            rgb.B = static_cast<T>(v2 + g - range_ / 2); // new B
            return rgb;
        }